

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigTrans.c
# Opt level: O2

Aig_Man_t *
Saig_ManTimeframeSimplify(Aig_Man_t *pAig,int nFrames,int nFramesMax,int fInit,int fVerbose)

{
  Aig_Man_t *pAVar1;
  abctime aVar2;
  Aig_Man_t *pAVar3;
  abctime aVar4;
  Aig_Man_t *pAVar5;
  int iVar6;
  
  pAVar1 = Saig_ManFramesNonInitial(pAig,nFrames);
  aVar2 = Abc_Clock();
  pAVar3 = Fra_FraigEquivence(pAVar1,1000,0);
  if (fVerbose != 0) {
    Aig_ManPrintStats(pAVar1);
    pAVar5 = pAVar3;
    Aig_ManPrintStats(pAVar3);
    iVar6 = (int)pAVar5;
    Abc_Print(iVar6,"%s =","Fraiging");
    aVar4 = Abc_Clock();
    Abc_Print(iVar6,"%9.2f sec\n",(double)(aVar4 - aVar2) / 1000000.0);
  }
  Aig_ManStop(pAVar3);
  if (pAVar1->pReprs == (Aig_Obj_t **)0x0) {
    __assert_fail("pFrames->pReprs != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigTrans.c"
                  ,0x18c,"Aig_Man_t *Saig_ManTimeframeSimplify(Aig_Man_t *, int, int, int, int)");
  }
  Saig_ManCreateMapping(pAig,pAVar1,nFrames);
  Aig_ManStop(pAVar1);
  Saig_ManStopMap1(pAig);
  aVar2 = Abc_Clock();
  pAVar1 = pAig;
  pAVar3 = Saig_ManFramesInitialMapped(pAig,nFrames,nFramesMax,fInit);
  iVar6 = (int)pAVar1;
  Abc_Print(iVar6,"%s =","Mapped");
  aVar4 = Abc_Clock();
  Abc_Print(iVar6,"%9.2f sec\n",(double)(aVar4 - aVar2) / 1000000.0);
  Saig_ManStopMap2(pAig);
  aVar2 = Abc_Clock();
  pAVar1 = pAig;
  pAVar5 = Saig_ManFramesInitialMapped(pAig,nFrames,nFramesMax,fInit);
  iVar6 = (int)pAVar1;
  Abc_Print(iVar6,"%s =","Normal");
  aVar4 = Abc_Clock();
  Abc_Print(iVar6,"%9.2f sec\n",(double)(aVar4 - aVar2) / 1000000.0);
  if (fVerbose != 0) {
    Aig_ManPrintStats(pAVar5);
    Aig_ManPrintStats(pAVar3);
  }
  Aig_ManStop(pAVar5);
  if (pAig->pData == (void *)0x0) {
    if (pAig->pData2 == (void *)0x0) {
      return pAVar3;
    }
    __assert_fail("!Saig_ManHasMap2(pAig)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigTrans.c"
                  ,0x1a2,"Aig_Man_t *Saig_ManTimeframeSimplify(Aig_Man_t *, int, int, int, int)");
  }
  __assert_fail("!Saig_ManHasMap1(pAig)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigTrans.c"
                ,0x1a1,"Aig_Man_t *Saig_ManTimeframeSimplify(Aig_Man_t *, int, int, int, int)");
}

Assistant:

Aig_Man_t * Saig_ManTimeframeSimplify( Aig_Man_t * pAig, int nFrames, int nFramesMax, int fInit, int fVerbose )
{
//    extern Aig_Man_t * Fra_FraigEquivence( Aig_Man_t * pManAig, int nConfMax, int fProve );
    Aig_Man_t * pFrames, * pFraig, * pRes1, * pRes2;
    abctime clk;
    // create uninitialized timeframes with map1
    pFrames = Saig_ManFramesNonInitial( pAig, nFrames );
    // perform fraiging for the unrolled timeframes
clk = Abc_Clock();
    pFraig = Fra_FraigEquivence( pFrames, 1000, 0 );
    // report the results
    if ( fVerbose )
    {
        Aig_ManPrintStats( pFrames );
        Aig_ManPrintStats( pFraig );
ABC_PRT( "Fraiging", Abc_Clock() - clk );
    }
    Aig_ManStop( pFraig );
    assert( pFrames->pReprs != NULL );
    // create AIG with map2
    Saig_ManCreateMapping( pAig, pFrames, nFrames );
    Aig_ManStop( pFrames );
    Saig_ManStopMap1( pAig );
    // create reduced initialized timeframes
clk = Abc_Clock();
    pRes2 = Saig_ManFramesInitialMapped( pAig, nFrames, nFramesMax, fInit );
ABC_PRT( "Mapped", Abc_Clock() - clk );
    // free mapping
    Saig_ManStopMap2( pAig );
clk = Abc_Clock();
    pRes1 = Saig_ManFramesInitialMapped( pAig, nFrames, nFramesMax, fInit );
ABC_PRT( "Normal", Abc_Clock() - clk );
    // report the results
    if ( fVerbose )
    {
        Aig_ManPrintStats( pRes1 );
        Aig_ManPrintStats( pRes2 );
    }
    Aig_ManStop( pRes1 );
    assert( !Saig_ManHasMap1(pAig) );
    assert( !Saig_ManHasMap2(pAig) );
    return pRes2;
}